

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

shared_ptr<helics::Core> helics::CoreFactory::getEmptyCore(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<helics::Core> sVar1;
  
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (in_RDI,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)emptyCore);
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> getEmptyCore()
{
    return emptyCore;
}